

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeFlushCase::init
          (MapBufferRangeFlushCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  EVP_PKEY_CTX *ctx_00;
  char *__s;
  bool bVar5;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1a0._0_8_ =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
             ,0x66);
  pcVar4 = "Half of the buffer is mapped.";
  if (this->m_fullUpload != false) {
    pcVar4 = "The whole buffer is mapped.";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar4,(ulong)(this->m_fullUpload ^ 1) * 2 + 0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  pcVar4 = "The whole mapped range is flushed in one flush call.";
  if ((this->m_flushPartial & 1U) != 0) {
    pcVar4 = "Half of the buffer range is flushed.";
  }
  __s = "The mapped range is partitioned to 4 subranges and each partition is flushed separately.";
  if (this->m_flushInParts == false) {
    __s = pcVar4;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  pcVar4 = 
  "The buffer has not been used before mapping and is allocated with unspecified contents.\n";
  bVar5 = this->m_useUnusedUnspecifiedBuffer == false;
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x58;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  pcVar4 = "The buffer has not been used before mapping and is allocated with specified contents.\n"
  ;
  bVar5 = this->m_useUnusedSpecifiedBuffer == false;
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x56;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  pcVar4 = "The buffer has previously been used in a drawing operation.\n";
  bVar5 = ((this->m_useUnusedUnspecifiedBuffer | this->m_useUnusedSpecifiedBuffer) & 1U) != 0;
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x3c;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Map bits:\n",10);
  bVar5 = (this->m_mapFlags & 2) == 0;
  pcVar4 = "\tGL_MAP_WRITE_BIT\n";
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x12;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  bVar5 = (this->m_mapFlags & 1) == 0;
  pcVar4 = "\tGL_MAP_READ_BIT\n";
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x11;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  bVar5 = (this->m_mapFlags & 4) == 0;
  pcVar4 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x1d;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  bVar5 = (this->m_mapFlags & 8) == 0;
  pcVar4 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar3 = 0x1e;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  lVar3 = 0;
  bVar5 = (this->m_mapFlags & 0x20) == 0;
  pcVar4 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if (bVar5) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  if (!bVar5) {
    lVar3 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  pcVar4 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  lVar3 = 0x1b;
  if ((this->m_mapFlags & 0x10) == 0) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void MapBufferRangeFlushCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
		<< ((m_fullUpload) ? ("The whole buffer is mapped.") : ("Half of the buffer is mapped.")) << "\n"
		<< ((m_flushInParts) ?
			("The mapped range is partitioned to 4 subranges and each partition is flushed separately.") :
			(m_flushPartial) ?
				("Half of the buffer range is flushed.") :
				("The whole mapped range is flushed in one flush call.")) << "\n"
		<< ((m_useUnusedUnspecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with unspecified contents.\n") : (""))
		<< ((m_useUnusedSpecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with specified contents.\n") : (""))
		<< ((!m_useUnusedSpecifiedBuffer && !m_useUnusedUnspecifiedBuffer) ? ("The buffer has previously been used in a drawing operation.\n") : (""))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<MapBufferRangeFlushDuration>::init();
}